

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

ImplicitWeakMessage *
google::protobuf::Arena::CreateMessageInternal<google::protobuf::internal::ImplicitWeakMessage>
          (Arena *arena)

{
  ImplicitWeakMessage *pIVar1;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar2;
  
  if (arena == (Arena *)0x0) {
    pIVar1 = (ImplicitWeakMessage *)operator_new(0x30);
    (pIVar1->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004e16b0;
    (pIVar1->super_MessageLite)._internal_metadata_.ptr_ = 0;
  }
  else {
    pVar2 = AllocateAlignedWithCleanup
                      (arena,0x30,(type_info *)&internal::ImplicitWeakMessage::typeinfo);
    pIVar1 = (ImplicitWeakMessage *)pVar2.first;
    (pVar2.second)->elem = pIVar1;
    (pVar2.second)->cleanup =
         internal::arena_destruct_object<google::protobuf::internal::ImplicitWeakMessage>;
    (pIVar1->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004e16b0;
    (pIVar1->super_MessageLite)._internal_metadata_.ptr_ = (intptr_t)arena;
  }
  (pIVar1->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ImplicitWeakMessage_004e4b98;
  (pIVar1->data_)._M_dataplus._M_p = (pointer)&(pIVar1->data_).field_2;
  (pIVar1->data_)._M_string_length = 0;
  (pIVar1->data_).field_2._M_local_buf[0] = '\0';
  return pIVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }